

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

WeierstrassPoint *
ecc_weierstrass_point_new_from_x(WeierstrassCurve *wc,mp_int *xorig,uint desired_y_parity)

{
  uint uVar1;
  undefined8 in_RAX;
  mp_int *x;
  mp_int *pmVar2;
  mp_int *pmVar3;
  mp_int *x_00;
  mp_int *x_01;
  WeierstrassPoint *pWVar4;
  uint success;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (wc->sc != (ModsqrtContext *)0x0) {
    x = monty_import(wc->mc,xorig);
    pmVar2 = monty_mul(wc->mc,x,x);
    pmVar3 = monty_add(wc->mc,pmVar2,wc->a);
    x_00 = monty_mul(wc->mc,pmVar3,x);
    x_01 = monty_add(wc->mc,x_00,wc->b);
    mp_free(pmVar2);
    mp_free(pmVar3);
    mp_free(x_00);
    pmVar2 = monty_modsqrt(wc->sc,x_01,&local_34);
    mp_free(x_01);
    if (local_34 == 0) {
      mp_free(x);
      mp_free(pmVar2);
      pWVar4 = (WeierstrassPoint *)0x0;
    }
    else {
      pmVar3 = monty_export(wc->mc,pmVar2);
      uVar1 = mp_get_bit(pmVar3,0);
      mp_sub_into(pmVar3,wc->p,pmVar2);
      mp_select_into(pmVar2,pmVar2,pmVar3,(desired_y_parity ^ uVar1) & 1);
      mp_free(pmVar3);
      pWVar4 = ecc_weierstrass_point_new_imported(wc,x,pmVar2);
    }
    return pWVar4;
  }
  __assert_fail("wc->sc",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-arithmetic.c"
                ,0x94,
                "WeierstrassPoint *ecc_weierstrass_point_new_from_x(WeierstrassCurve *, mp_int *, unsigned int)"
               );
}

Assistant:

WeierstrassPoint *ecc_weierstrass_point_new_from_x(
    WeierstrassCurve *wc, mp_int *xorig, unsigned desired_y_parity)
{
    assert(wc->sc);

    /*
     * The curve equation is y^2 = x^3 + ax + b, which is already
     * conveniently in a form where we can compute the RHS and take
     * the square root of it to get y.
     */
    unsigned success;

    mp_int *x = monty_import(wc->mc, xorig);

    /*
     * Compute the RHS of the curve equation. We don't need to take
     * account of z here, because we're constructing the point from
     * scratch. So it really is just x^3 + ax + b.
     */
    mp_int *x2 = monty_mul(wc->mc, x, x);
    mp_int *x2_plus_a = monty_add(wc->mc, x2, wc->a);
    mp_int *x3_plus_ax = monty_mul(wc->mc, x2_plus_a, x);
    mp_int *rhs = monty_add(wc->mc, x3_plus_ax, wc->b);
    mp_free(x2);
    mp_free(x2_plus_a);
    mp_free(x3_plus_ax);

    mp_int *y = monty_modsqrt(wc->sc, rhs, &success);
    mp_free(rhs);

    if (!success) {
        /* Failure! x^3+ax+b worked out to be a number that has no
         * square root mod p. In this situation there's no point in
         * trying to be time-constant, since the protocol sequence is
         * going to diverge anyway when we complain to whoever gave us
         * this bogus value. */
        mp_free(x);
        mp_free(y);
        return NULL;
    }

    /*
     * Choose whichever of y and p-y has the specified parity (of its
     * lowest positive residue mod p).
     */
    mp_int *tmp = monty_export(wc->mc, y);
    unsigned flip = (mp_get_bit(tmp, 0) ^ desired_y_parity) & 1;
    mp_sub_into(tmp, wc->p, y);
    mp_select_into(y, y, tmp, flip);
    mp_free(tmp);

    return ecc_weierstrass_point_new_imported(wc, x, y);
}